

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall DeleteUserRequest::DeleteUserRequest(DeleteUserRequest *this,Event *e)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keysToBeInEvent;
  bool bVar1;
  int iVar2;
  EventNotValid *this_00;
  reference this_01;
  string *local_128;
  allocator local_b9;
  string local_b8 [34];
  undefined1 local_96;
  allocator local_95 [20];
  allocator local_81;
  string *local_80;
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  undefined8 local_30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_28;
  Event *local_18;
  Event *e_local;
  DeleteUserRequest *this_local;
  
  local_18 = e;
  e_local = (Event *)this;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_28,e);
  local_96 = 1;
  local_80 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"type",&local_81);
  local_80 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"id",local_95);
  local_96 = 0;
  local_38 = (iterator)local_78;
  local_30 = 2;
  keysToBeInEvent._M_len = 2;
  keysToBeInEvent._M_array = local_38;
  bVar1 = checkEventKeys(&local_28,keysToBeInEvent);
  local_128 = (string *)&local_38;
  do {
    local_128 = local_128 + -0x20;
    std::__cxx11::string::~string(local_128);
  } while (local_128 != local_78);
  std::allocator<char>::~allocator((allocator<char> *)local_95);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_01 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)e,"id");
    iVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<int,_int,_0>(this_01);
    this->id = iVar2;
    return;
  }
  this_00 = (EventNotValid *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Improper DELETE_USER_REQUEST",&local_b9);
  EventNotValid::EventNotValid(this_00,(string *)local_b8);
  __cxa_throw(this_00,&EventNotValid::typeinfo,EventNotValid::~EventNotValid);
}

Assistant:

explicit DeleteUserRequest(Event e){
	  if(!checkEventKeys(e, {"type", "id"})) {
		  throw EventNotValid("Improper DELETE_USER_REQUEST");
	  }
	  try{
		  id = e["id"].get<int>();
	  }
	  catch(...){
		  throw EventNotValid("Improper GET_N_NEW_POSTS_RESPONSE");
	  }
  }